

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,off_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Xword EVar1;
  Elf64_Addr EVar2;
  Elf64_Off EVar3;
  Elf64_Xword EVar4;
  Elf64_Xword EVar5;
  Elf64_Word EVar6;
  Elf64_Word EVar7;
  Elf64_Word EVar8;
  Elf64_Word EVar9;
  Elf64_Word *pEVar10;
  int iVar11;
  ulong uVar13;
  long lVar14;
  size_t count;
  Elf64_Word *pEVar15;
  undefined6 in_register_00000032;
  int iVar16;
  Elf64_Shdr buf [16];
  undefined1 local_438 [4];
  Elf64_Word aEStack_434 [257];
  int iVar12;
  
  iVar16 = 0;
  while( true ) {
    iVar12 = (int)CONCAT62(in_register_00000032,sh_num);
    iVar11 = iVar12 - iVar16;
    if (iVar11 == 0 || iVar12 < iVar16) {
      return false;
    }
    count = (long)iVar11 << 6;
    if (0x3ff < count) {
      count = 0x400;
    }
    uVar13 = ReadFromOffset(fd,local_438,count,(long)iVar16 * 0x40 + sh_offset);
    if (uVar13 == 0xffffffffffffffff) break;
    if (((uVar13 & 0x3f) != 0) || (0x43f < uVar13)) {
      abort();
    }
    lVar14 = (uVar13 >> 6) + 1;
    pEVar10 = aEStack_434;
    while (pEVar15 = pEVar10, lVar14 = lVar14 + -1, lVar14 != 0) {
      pEVar10 = pEVar15 + 0x10;
      if (*pEVar15 == type) {
        EVar8 = pEVar15[-1];
        EVar9 = pEVar15[0];
        EVar1 = *(Elf64_Xword *)(pEVar15 + 1);
        EVar2 = *(Elf64_Addr *)(pEVar15 + 3);
        EVar3 = *(Elf64_Off *)(pEVar15 + 5);
        EVar4 = *(Elf64_Xword *)(pEVar15 + 7);
        EVar6 = pEVar15[9];
        EVar7 = pEVar15[10];
        EVar5 = *(Elf64_Xword *)(pEVar15 + 0xd);
        out->sh_addralign = *(Elf64_Xword *)(pEVar15 + 0xb);
        out->sh_entsize = EVar5;
        out->sh_size = EVar4;
        out->sh_link = EVar6;
        out->sh_info = EVar7;
        out->sh_addr = EVar2;
        out->sh_offset = EVar3;
        out->sh_name = EVar8;
        out->sh_type = EVar9;
        out->sh_flags = EVar1;
        return true;
      }
    }
    iVar16 = iVar16 + (int)(uVar13 >> 6);
  }
  return false;
}

Assistant:

static ATTRIBUTE_NOINLINE bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const off_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (int i = 0; i < sh_num;) {
    const ssize_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const ssize_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_headers_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (int j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}